

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

uint8_t __thiscall ymfm::ym2608::read_status_hi(ym2608 *this)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  
  bVar2 = (byte)((this->m_adpcm_b).m_channel._M_t.
                 super___uniq_ptr_impl<ymfm::adpcm_b_channel,_std::default_delete<ymfm::adpcm_b_channel>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ymfm::adpcm_b_channel_*,_std::default_delete<ymfm::adpcm_b_channel>_>
                 .super__Head_base<0UL,_ymfm::adpcm_b_channel_*,_false>._M_head_impl)->m_status;
  bVar3 = bVar2 * '\x04';
  bVar3 = (~this->m_flag_control | 0xe0) &
          ((bVar2 & 4) << 3 | bVar3 & 8 | bVar3 & 4 | (this->m_fm).m_status & 0x53);
  (this->m_fm).m_status = bVar3;
  (*(code *)((this->m_fm).m_intf)->m_engine[1]._vptr_ymfm_engine_callbacks)();
  cVar1 = (*(code *)((this->m_fm).m_intf)->m_engine[4]._vptr_ymfm_engine_callbacks)();
  bVar2 = bVar3 | 0x80;
  if (cVar1 == '\0') {
    bVar2 = bVar3;
  }
  return bVar2;
}

Assistant:

uint8_t ym2608::read_status_hi()
{
	// fetch regular status
	uint8_t status = m_fm.status() & ~(STATUS_ADPCM_B_EOS | STATUS_ADPCM_B_BRDY | STATUS_ADPCM_B_PLAYING);

	// fetch ADPCM-B status, and merge in the bits
	uint8_t adpcm_status = m_adpcm_b.status();
	if ((adpcm_status & adpcm_b_channel::STATUS_EOS) != 0)
		status |= STATUS_ADPCM_B_EOS;
	if ((adpcm_status & adpcm_b_channel::STATUS_BRDY) != 0)
		status |= STATUS_ADPCM_B_BRDY;
	if ((adpcm_status & adpcm_b_channel::STATUS_PLAYING) != 0)
		status |= STATUS_ADPCM_B_PLAYING;

	// turn off any bits that have been requested to be masked
	status &= ~(m_flag_control & 0x1f);

	// update the status so that IRQs are propagated
	m_fm.set_reset_status(status, ~status);

	// merge in the busy flag
	if (m_fm.intf().ymfm_is_busy())
		status |= fm_engine::STATUS_BUSY;
	return status;
}